

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O2

void __thiscall duel::discardCard(duel *this,uint position,hand *hand__)

{
  vector<card,_std::allocator<card>_> *this_00;
  reference pvVar1;
  
  this_00 = &hand__->hand_;
  pvVar1 = std::vector<card,_std::allocator<card>_>::at(this_00,(ulong)position);
  if (pvVar1->cardType == 0) {
    hand__->regularCards = hand__->regularCards - 1;
  }
  else {
    hand__->specialCards = hand__->specialCards - 1;
  }
  std::vector<card,_std::allocator<card>_>::erase
            (this_00,(this_00->super__Vector_base<card,_std::allocator<card>_>)._M_impl.
                     super__Vector_impl_data._M_start + position);
  return;
}

Assistant:

void duel::discardCard(unsigned int position, hand& hand__) {
    if (isRegularCard(hand__.hand_.at(position))) hand__.setRegularCards(hand__.getRegularCards()-1);
    else hand__.setSpecialCards(hand__.getSpecialCards()-1);
    hand__.hand_.erase(hand__.hand_.begin() + position);
}